

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O1

bool __thiscall ON_BrepTrimArray::Read(ON_BrepTrimArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  ON_BrepTrim *pOVar3;
  byte bVar4;
  int iVar5;
  int count;
  int major_version;
  int minor_version;
  ON__UINT32 tcode;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  ON__INT32 local_48;
  int local_44 [3];
  ON__INT64 local_38;
  
  ON_ClassArray<ON_BrepTrim>::Empty((ON_ClassArray<ON_BrepTrim> *)this);
  local_44[2] = 0;
  local_38 = 0;
  local_48 = 0;
  local_44[0] = 0;
  local_44[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,(uint *)(local_44 + 2),&local_38);
  if (bVar1) {
    bVar4 = bVar1 && local_44[2] == 0x40008000;
    if (bVar1 && local_44[2] == 0x40008000) {
      bVar4 = ON_BinaryArchive::Read3dmChunkVersion(file,local_44,local_44 + 1);
    }
    if ((bool)bVar4 != false) {
      if (local_44[0] == 1) {
        bVar4 = ON_BinaryArchive::ReadInt(file,&local_48);
        ON_ClassArray<ON_BrepTrim>::SetCapacity((ON_ClassArray<ON_BrepTrim> *)this,(long)local_48);
        if (((bool)bVar4) && (0 < local_48)) {
          iVar5 = 1;
          do {
            pOVar3 = ON_ClassArray<ON_BrepTrim>::AppendNew((ON_ClassArray<ON_BrepTrim> *)this);
            iVar2 = (*(pOVar3->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object
                      ._vptr_ON_Object[0xb])(pOVar3,file);
            bVar4 = (byte)iVar2;
            if ((bVar4 != 0) &&
               (pOVar3->m_trim_index !=
                (this->super_ON_ObjectArray<ON_BrepTrim>).super_ON_ClassArray<ON_BrepTrim>.m_count +
                -1)) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_io.cpp"
                         ,0x1e3,"","Invalid value of m_trim_index");
              pOVar3->m_trim_index =
                   (this->super_ON_ObjectArray<ON_BrepTrim>).super_ON_ClassArray<ON_BrepTrim>.
                   m_count + -1;
            }
            bVar1 = iVar5 < local_48;
            iVar5 = iVar5 + 1;
          } while ((bVar4 & bVar1) != 0);
        }
      }
      else {
        bVar4 = 0;
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar4);
  }
  return bVar1;
}

Assistant:

bool ON_BrepTrimArray::Read( ON_BinaryArchive& file )
{
  Empty();
  ON__UINT32 tcode = 0;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
  int count = 0;
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
  if (rc) {
    if (tcode != TCODE_ANONYMOUS_CHUNK)
      rc = false;
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc) {
      if ( major_version==1 ) {
        if (rc) rc = file.ReadInt(&count);
        SetCapacity(count);
        for ( i = 0; i < count && rc ; i++ ) {
          ON_BrepTrim& trim = AppendNew();
          rc = trim.Read(file)?true:false;
          if ( rc )
          {
            if ( trim.m_trim_index != m_count-1 )
            {
              // 28 May 2013 Dale Lear
              //   Fix http://mcneel.myjetbrains.com/youtrack/issue/RH-18299
              //   Fix bogus index values to prevent crashes.
              ON_ERROR("Invalid value of m_trim_index");
              trim.m_trim_index = m_count-1;
            }
          }
        }    
      }
      else {
        rc = 0;
      }
    }
    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}